

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O0

int __thiscall
pybind11::detail::process_attribute<pybind11::arg_v,_void>::init
          (process_attribute<pybind11::arg_v,_void> *this,EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  function_record *__args;
  bool bVar2;
  int extraout_EAX;
  vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
  *pvVar3;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *__args_1;
  handle *__args_2;
  bool local_2c2;
  bool local_2c1;
  char local_2c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0 [39];
  allocator local_279;
  string local_278 [32];
  string local_258 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238 [32];
  PyObject *local_218;
  str local_210;
  str local_208 [4];
  string local_1e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [32];
  PyObject *local_180;
  str local_178;
  str local_170 [4];
  string local_150 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [39];
  allocator local_a9;
  string local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [55];
  allocator local_51;
  string local_50 [8];
  string descr;
  bool local_2a;
  bool local_29;
  handle local_28;
  void *local_20;
  EVP_PKEY_CTX *local_18;
  function_record *r_local;
  arg_v *a_local;
  
  local_18 = ctx;
  r_local = (function_record *)this;
  if ((((byte)ctx[0x59] >> 6 & 1) != 0) &&
     (bVar2 = std::
              vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
              ::empty((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                       *)(ctx + 0x18)), bVar2)) {
    pvVar3 = (vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
              *)(local_18 + 0x18);
    local_20 = (void *)0x0;
    memset(&local_28,0,8);
    handle::handle(&local_28);
    local_29 = true;
    local_2a = false;
    std::vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
    ::emplace_back<char_const(&)[5],decltype(nullptr),pybind11::handle,bool,bool>
              (pvVar3,(char (*) [5])"self",&local_20,&local_28,&local_29,&local_2a);
  }
  bVar2 = handle::operator_cast_to_bool((handle *)&r_local->signature);
  __args = r_local;
  if (bVar2) {
    pvVar3 = (vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
              *)(local_18 + 0x18);
    __args_1 = &r_local->args;
    __args_2 = handle::inc_ref((handle *)&r_local->signature);
    local_2c1 = (bool)((*(byte *)&r_local->doc & 1 ^ 0xff) & 1);
    local_2c2 = (bool)(*(byte *)&r_local->doc >> 1 & 1);
    std::vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
    ::emplace_back<char_const*const&,char_const*const&,pybind11::handle_const&,bool,bool_const&>
              (pvVar3,&__args->name,(char **)__args_1,__args_2,&local_2c1,&local_2c2);
    return extraout_EAX;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"\'",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if (r_local->name != (char *)0x0) {
    pcVar1 = r_local->name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,pcVar1,&local_a9);
    std::operator+(local_88,(char *)local_a8);
    std::__cxx11::string::operator+=(local_50,(string *)local_88);
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  }
  std::operator+(local_d0,(char *)&(r_local->args).
                                   super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::operator+=(local_50,(string *)local_d0);
  std::__cxx11::string::~string((string *)local_d0);
  if (((byte)local_18[0x59] >> 6 & 1) == 0) {
    if (*(long *)local_18 != 0) {
      pcVar1 = *(char **)local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_278,pcVar1,&local_279);
      std::operator+((char *)local_258,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     " in function \'");
      std::operator+(local_238,(char *)local_258);
      std::__cxx11::string::operator+=(local_50,(string *)local_238);
      std::__cxx11::string::~string((string *)local_238);
      std::__cxx11::string::~string(local_258);
      std::__cxx11::string::~string(local_278);
      std::allocator<char>::~allocator((allocator<char> *)&local_279);
    }
  }
  else if (*(long *)local_18 == 0) {
    local_218 = *(PyObject **)(local_18 + 0x68);
    str::str(&local_210,(handle)local_218);
    str::operator_cast_to_string(local_208);
    std::operator+((char *)local_1e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   " in method of \'");
    std::operator+(local_1c8,(char *)local_1e8);
    std::__cxx11::string::operator+=(local_50,(string *)local_1c8);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::string::~string((string *)local_208);
    str::~str(&local_210);
  }
  else {
    local_180 = *(PyObject **)(local_18 + 0x68);
    str::str(&local_178,(handle)local_180);
    str::operator_cast_to_string(local_170);
    std::operator+((char *)local_150,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   " in method \'");
    std::operator+(local_130,(char *)local_150);
    pcVar1 = *(char **)local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,pcVar1,&local_1a1);
    std::operator+(local_110,local_130);
    std::operator+(local_f0,(char *)local_110);
    std::__cxx11::string::operator+=(local_50,(string *)local_f0);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)local_110);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    std::__cxx11::string::~string((string *)local_130);
    std::__cxx11::string::~string(local_150);
    std::__cxx11::string::~string((string *)local_170);
    str::~str(&local_178);
  }
  std::operator+(local_2c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "arg(): could not convert default argument ");
  std::operator+(local_2a0,local_2c0);
  pybind11_fail(local_2a0);
}

Assistant:

static void init(const arg_v &a, function_record *r) {
        if (r->is_method && r->args.empty())
            r->args.emplace_back("self", nullptr /*descr*/, handle() /*parent*/, true /*convert*/, false /*none not allowed*/);

        if (!a.value) {
#if !defined(NDEBUG)
            std::string descr("'");
            if (a.name) descr += std::string(a.name) + ": ";
            descr += a.type + "'";
            if (r->is_method) {
                if (r->name)
                    descr += " in method '" + (std::string) str(r->scope) + "." + (std::string) r->name + "'";
                else
                    descr += " in method of '" + (std::string) str(r->scope) + "'";
            } else if (r->name) {
                descr += " in function '" + (std::string) r->name + "'";
            }
            pybind11_fail("arg(): could not convert default argument "
                          + descr + " into a Python object (type not registered yet?)");
#else
            pybind11_fail("arg(): could not convert default argument "
                          "into a Python object (type not registered yet?). "
                          "Compile in debug mode for more information.");
#endif
        }
        r->args.emplace_back(a.name, a.descr, a.value.inc_ref(), !a.flag_noconvert, a.flag_none);
    }